

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Parser::ParseFunctionDeclaration(Parser *this)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  pointer pFVar3;
  FunctionSignature *copy;
  Symbol *pSVar4;
  Library *this_00;
  undefined8 this_01;
  undefined8 uVar5;
  bool bVar6;
  mapped_type *this_02;
  FunctionSignature *sig;
  pointer signature_00;
  pointer pbVar7;
  FunctionSignature **sig_1;
  element_type *peVar8;
  size_t count;
  size_t count_1;
  FunctionSignature signature;
  size_t local_4d8;
  undefined1 local_4d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  local_4c0;
  size_t local_4a8;
  pointer local_4a0;
  FunctionSignature local_498;
  
  local_498.m_staticArena.m_ptr = (char *)&local_498;
  local_498.m_id = 0;
  local_498.m_visibility = Local;
  local_498.m_libraryName._M_dataplus._M_p = (pointer)&local_498.m_libraryName.field_2;
  local_498.m_libraryName._M_string_length = 0;
  local_498.m_libraryName.field_2._M_local_buf[0] = '\0';
  local_498.m_parts.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.m_parts.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8 = 0;
  local_498.m_parts.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  signature_00 = (this->m_localFunctions).
                 super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pFVar3 = (this->m_localFunctions).
           super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_498.m_parts.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Tp_alloc_type.m_arena = (arena_type *)local_498.m_staticArena.m_ptr;
  if (signature_00 != pFVar3) {
    local_4d8 = 0;
    do {
      bVar6 = CheckFunctionSignature
                        (this,(this->m_currentSymbol)._M_current,signature_00,(size_t *)local_4d0);
      if ((bVar6) &&
         ((ulong)((long)local_498.m_parts.
                        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_498.m_parts.
                       super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_start) <
          (ulong)((long)(signature_00->m_parts).
                        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(signature_00->m_parts).
                       super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_start))) {
        FunctionSignature::operator=(&local_498,signature_00);
        local_4d8 = CONCAT44(local_4d0._4_4_,local_4d0._0_4_);
      }
      signature_00 = signature_00 + 1;
    } while (signature_00 != pFVar3);
  }
  pbVar7 = (this->m_importList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_4a0 = (this->m_importList).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != local_4a0) {
    do {
      Runtime::GetLibrary((Runtime *)local_4d0,
                          (String *)
                          (this->m_runtime).
                          super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         );
      this_01 = local_4d0._8_8_;
      this_00 = (Library *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_);
      if ((element_type *)local_4d0._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(((_Rep_type *)local_4d0._8_8_)->_M_impl).super__Rb_tree_header;
          (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
          UNLOCK();
        }
        else {
          p_Var1 = &(((_Rep_type *)local_4d0._8_8_)->_M_impl).super__Rb_tree_header;
          (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
        }
      }
      if ((element_type *)local_4d0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d0._8_8_);
      }
      Library::Functions((FunctionPtrList *)local_4d0,this_00);
      uVar5 = local_4d0._8_8_;
      for (peVar8 = (element_type *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_);
          peVar8 != (element_type *)uVar5;
          peVar8 = (element_type *)&peVar8->super_enable_shared_from_this<Jinx::Impl::Runtime>) {
        bVar6 = CheckFunctionSignature
                          (this,(this->m_currentSymbol)._M_current,
                           (FunctionSignature *)(peVar8->super_IRuntime)._vptr_IRuntime,&local_4a8);
        if ((bVar6) &&
           (copy = (FunctionSignature *)(peVar8->super_IRuntime)._vptr_IRuntime,
           (ulong)((long)local_498.m_parts.
                         super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_498.m_parts.
                        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                        ._M_impl.super__Vector_impl_data._M_start) <
           (ulong)((long)(copy->m_parts).
                         super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(copy->m_parts).
                        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                        ._M_impl.super__Vector_impl_data._M_start))) {
          FunctionSignature::operator=(&local_498,copy);
          local_4d8 = local_4a8;
        }
      }
      std::
      _Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
      ::~_Vector_base((_Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                       *)local_4d0);
      if ((element_type *)this_01 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_4a0);
  }
  if (local_4d8 != 0) {
    pSVar4 = (this->m_currentSymbol)._M_current;
    uVar2 = pSVar4[local_4d8 - 1].lineNumber;
    (this->m_currentSymbol)._M_current = pSVar4 + local_4d8;
    this->m_lastLine = uVar2;
  }
  EmitOpcode(this,PushVal);
  local_4d0._0_4_ = Null;
  Variant::SetFunction((Variant *)local_4d0,local_498.m_id);
  Variant::Write((Variant *)local_4d0,&this->m_writer);
  Variant::~Variant((Variant *)local_4d0);
  FunctionSignature::GetName_abi_cxx11_((String *)local_4d0,&local_498);
  local_4a8 = local_498.m_id;
  this_02 = std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
            ::operator[](&this->m_idNameMap,&local_4a8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
            (this_02,(basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_4d0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_) != &local_4c0) {
    MemFree((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_),
            (size_t)(local_4c0._M_allocated_capacity + 1));
  }
  std::
  vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ::~vector(&local_498.m_parts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_498.m_libraryName._M_dataplus._M_p != &local_498.m_libraryName.field_2) {
    MemFree(local_498.m_libraryName._M_dataplus._M_p,
            CONCAT71(local_498.m_libraryName.field_2._M_allocated_capacity._1_7_,
                     local_498.m_libraryName.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

inline_t void Parser::ParseFunctionDeclaration()
	{
		FunctionSignature signature;
		size_t symCount = 0;

		// Check for match in local functions
		for (const auto & sig : m_localFunctions)
		{
			size_t count;
			if (CheckFunctionSignature(m_currentSymbol, sig, &count))
			{
				if (sig.GetLength() > signature.GetLength())
				{
					signature = sig;
					symCount = count;
				}
			}
		}

		// Check for match in all import libraries
		for (const auto & import : m_importList)
		{
			auto library = m_runtime->GetLibraryInternal(import);
			auto functions = library->Functions();
			for (const auto & sig : functions)
			{
				size_t count;
				if (CheckFunctionSignature(m_currentSymbol, *sig, &count))
				{
					if (sig->GetLength() > signature.GetLength())
					{
						signature = *sig;
						symCount = count;
					}
				}
			}
		}

		for (size_t i = 0; i < symCount; ++i)
			NextSymbol();

		// Push the function ID on the stack
		EmitOpcode(Opcode::PushVal);
		EmitValue(signature.GetId());
		m_idNameMap[signature.GetId()] = signature.GetName();
	}